

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall
duckdb::Linenoise::NextPosition
          (Linenoise *this,char *buf,size_t len,size_t *cpos,int *rows,int *cols,int plen)

{
  bool bVar1;
  int32_t iVar2;
  size_t sVar3;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  size_t in_RDI;
  int *in_R8;
  int *in_R9;
  int in_stack_00000008;
  int char_render_width;
  int sz;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  int in_stack_ffffffffffffffcc;
  
  bVar1 = IsNewline(*(char *)(in_RSI + *in_RCX));
  if (bVar1) {
    *in_R8 = *in_R8 + 1;
    *in_R9 = in_stack_00000008;
    *in_RCX = *in_RCX + 1;
    if (((*(char *)(in_RSI + (*in_RCX - 1)) == '\r') && (*in_RCX < in_RDX)) &&
       (*(char *)(in_RSI + *in_RCX) == '\n')) {
      *in_RCX = *in_RCX + 1;
    }
  }
  else {
    iVar2 = Utf8Proc::UTF8ToCodepoint((char *)(in_RSI + *in_RCX),(int *)&stack0xffffffffffffffcc);
    if (iVar2 < 0) {
      iVar4 = 1;
      *in_RCX = *in_RCX + 1;
    }
    else {
      sVar3 = Utf8Proc::RenderWidth
                        ((char *)in_R9,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         ,in_RDI);
      iVar4 = (int)sVar3;
      sVar3 = Utf8Proc::NextGraphemeCluster
                        ((char *)in_R8,(size_t)in_R9,CONCAT44(in_stack_ffffffffffffffcc,iVar4));
      *in_RCX = sVar3;
    }
    if (*(int *)(in_RDI + 0x48) < *in_R9 + iVar4) {
      *in_R8 = *in_R8 + 1;
      *in_R9 = iVar4;
    }
    *in_R9 = iVar4 + *in_R9;
  }
  return;
}

Assistant:

void Linenoise::NextPosition(const char *buf, size_t len, size_t &cpos, int &rows, int &cols, int plen) const {
	if (IsNewline(buf[cpos])) {
		// explicit newline! move to next line and insert a prompt
		rows++;
		cols = plen;
		cpos++;
		if (buf[cpos - 1] == '\r' && cpos < len && buf[cpos] == '\n') {
			cpos++;
		}
		return;
	}
	int sz;
	int char_render_width;
	if (duckdb::Utf8Proc::UTF8ToCodepoint(buf + cpos, sz) < 0) {
		char_render_width = 1;
		cpos++;
	} else {
		char_render_width = (int)duckdb::Utf8Proc::RenderWidth(buf, len, cpos);
		cpos = duckdb::Utf8Proc::NextGraphemeCluster(buf, len, cpos);
	}
	if (cols + char_render_width > ws.ws_col) {
		// exceeded l->cols, move to next row
		rows++;
		cols = char_render_width;
	}
	cols += char_render_width;
}